

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitDestructuredArray
               (ParseNode *lhs,RegSlot rhsLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ParseNode *list_00;
  code *pcVar1;
  bool bVar2;
  RegSlot iteratorReg;
  RegSlot methodReg;
  RegSlot R0;
  RegSlot R0_00;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  undefined4 *puVar3;
  ParseNodeArrLit *pPVar4;
  ByteCodeWriter *pBVar5;
  FuncInfo *pFVar6;
  ByteCodeLabel catchLabel;
  ByteCodeLabel finallyLabel;
  RegSlot RStack_50;
  bool isCoroutine;
  RegSlot regOffset;
  RegSlot regException;
  RegSlot shouldCallReturnFunctionLocationFinally;
  RegSlot shouldCallReturnFunctionLocation;
  RegSlot nextMethodReg;
  ParseNode *list;
  RegSlot iteratorLocation;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot rhsLocation_local;
  ParseNode *lhs_local;
  
  ByteCodeGenerator::StartStatement(byteCodeGenerator,lhs);
  iteratorReg = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetIterator(iteratorReg,rhsLocation,byteCodeGenerator,funcInfo);
  if (lhs->nop != knopArrayPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1ad6,"(lhs->nop == knopArrayPattern)","lhs->nop == knopArrayPattern");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pPVar4 = ParseNode::AsParseNodeArrLit(lhs);
  list_00 = (pPVar4->super_ParseNodeUni).pnode1;
  if (list_00 == (ParseNode *)0x0) {
    EmitIteratorClose(iteratorReg,byteCodeGenerator,funcInfo,false);
    FuncInfo::ReleaseTmpRegister(funcInfo,iteratorReg);
    ByteCodeGenerator::EndStatement(byteCodeGenerator,lhs);
  }
  else {
    methodReg = FuncInfo::AcquireTmpRegister(funcInfo);
    EmitGetObjectMethod(methodReg,iteratorReg,0x107,byteCodeGenerator,funcInfo);
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    R0_00 = FuncInfo::AcquireTmpRegister(funcInfo);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar5,LdFalse,R0);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg1(pBVar5,LdFalse,R0_00);
    ByteCodeGenerator::SetHasFinally(byteCodeGenerator,true);
    ByteCodeGenerator::SetHasTry(byteCodeGenerator,true);
    pFVar6 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    Js::ParseableFunctionInfo::SetDontInline(pFVar6->byteCodeFunction,true);
    RStack_50 = 0xffffffff;
    finallyLabel = -1;
    bVar2 = Js::FunctionProxy::IsCoroutine(&funcInfo->byteCodeFunction->super_FunctionProxy);
    if (bVar2) {
      RStack_50 = FuncInfo::AcquireTmpRegister(funcInfo);
      finallyLabel = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    labelID = Js::ByteCodeWriter::DefineLabel(pBVar5);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar5);
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(pBVar5,true);
    if (bVar2) {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::BrReg2(pBVar5,TryFinallyWithYield,labelID,RStack_50,finallyLabel);
      ByteCodeGenerator::PushJumpCleanupForTry
                (byteCodeGenerator,TryFinallyWithYield,labelID,RStack_50,finallyLabel);
    }
    else {
      pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::Br(pBVar5,TryFinally,labelID);
      ByteCodeGenerator::PushJumpCleanupForTry
                (byteCodeGenerator,TryFinally,labelID,0xffffffff,0xffffffff);
    }
    pBVar5 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Br(pBVar5,TryCatch,labelID_00);
    ByteCodeGenerator::PushJumpCleanupForTry
              (byteCodeGenerator,TryCatch,labelID_00,0xffffffff,0xffffffff);
    EmitDestructuredArrayCore(list_00,iteratorReg,methodReg,R0,R0_00,byteCodeGenerator,funcInfo);
    EmitIteratorCatchAndFinally
              (labelID_00,labelID,iteratorReg,R0,R0_00,RStack_50,finallyLabel,byteCodeGenerator,
               funcInfo,false);
    FuncInfo::ReleaseTmpRegister(funcInfo,methodReg);
    FuncInfo::ReleaseTmpRegister(funcInfo,iteratorReg);
    ByteCodeGenerator::EndStatement(byteCodeGenerator,lhs);
  }
  return;
}

Assistant:

void EmitDestructuredArray(
    ParseNode *lhs,
    Js::RegSlot rhsLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    byteCodeGenerator->StartStatement(lhs);
    Js::RegSlot iteratorLocation = funcInfo->AcquireTmpRegister();

    EmitGetIterator(iteratorLocation, rhsLocation, byteCodeGenerator, funcInfo);

    Assert(lhs->nop == knopArrayPattern);
    ParseNode *list = lhs->AsParseNodeArrLit()->pnode1;

    if (list == nullptr)
    { // Handline this case ([] = obj);
        EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo);

        // No elements to bind or assign.
        funcInfo->ReleaseTmpRegister(iteratorLocation);
        byteCodeGenerator->EndStatement(lhs);
        return;
    }

    Js::RegSlot nextMethodReg = funcInfo->AcquireTmpRegister();
    EmitGetObjectMethod(
        nextMethodReg,
        iteratorLocation,
        Js::PropertyIds::next,
        byteCodeGenerator,
        funcInfo);

    // This variable facilitates on when to call the return function (which is Iterator close). When we are emitting bytecode for destructuring element
    // this variable will be set to true.
    Js::RegSlot shouldCallReturnFunctionLocation = funcInfo->AcquireTmpRegister();
    Js::RegSlot shouldCallReturnFunctionLocationFinally = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse, shouldCallReturnFunctionLocationFinally);

    byteCodeGenerator->SetHasFinally(true);
    byteCodeGenerator->SetHasTry(true);
    byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);

    Js::RegSlot regException = Js::Constants::NoRegister;
    Js::RegSlot regOffset = Js::Constants::NoRegister;
    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    if (isCoroutine)
    {
        regException = funcInfo->AcquireTmpRegister();
        regOffset = funcInfo->AcquireTmpRegister();
    }

    // Insert try node here
    Js::ByteCodeLabel finallyLabel = byteCodeGenerator->Writer()->DefineLabel();
    Js::ByteCodeLabel catchLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    if (isCoroutine)
    {
        byteCodeGenerator->Writer()->BrReg2(Js::OpCode::TryFinallyWithYield, finallyLabel, regException, regOffset);
        byteCodeGenerator->PushJumpCleanupForTry(
            Js::OpCode::TryFinallyWithYield,
            finallyLabel,
            regException,
            regOffset);
    }
    else
    {
        byteCodeGenerator->Writer()->Br(Js::OpCode::TryFinally, finallyLabel);
        byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryFinally, finallyLabel);
    }

    byteCodeGenerator->Writer()->Br(Js::OpCode::TryCatch, catchLabel);
    byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryCatch, catchLabel);

    EmitDestructuredArrayCore(
        list,
        iteratorLocation,
        nextMethodReg,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        byteCodeGenerator,
        funcInfo);

    EmitIteratorCatchAndFinally(
        catchLabel,
        finallyLabel,
        iteratorLocation,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        regException,
        regOffset,
        byteCodeGenerator,
        funcInfo);

    funcInfo->ReleaseTmpRegister(nextMethodReg);
    funcInfo->ReleaseTmpRegister(iteratorLocation);

    byteCodeGenerator->EndStatement(lhs);
}